

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

bool __thiscall
BCLog::Logger::SetCategoryLogLevel(Logger *this,string_view category_str,string_view level_str)

{
  bool bVar1;
  int iVar2;
  optional<BCLog::Level> oVar3;
  _Storage<BCLog::Level,_true> *p_Var4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  LogFlags flag;
  LogFlags LStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = GetLogCategory(&LStack_28,category_str);
  if (bVar1) {
    oVar3 = GetLogLevel(level_str);
    if (2 < (int)oVar3.super__Optional_base<BCLog::Level,_true,_true>._M_payload.
                 super__Optional_payload_base<BCLog::Level>._M_payload ||
        ((ulong)oVar3.super__Optional_base<BCLog::Level,_true,_true>._M_payload.
                super__Optional_payload_base<BCLog::Level> >> 0x20 & 1) == 0) goto LAB_00405a2f;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        uVar5 = std::__throw_system_error(iVar2);
        pthread_mutex_unlock((pthread_mutex_t *)this);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          _Unwind_Resume(uVar5);
        }
      }
      goto LAB_00405ab0;
    }
    p_Var4 = (_Storage<BCLog::Level,_true> *)
             std::__detail::
             _Map_base<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_BCLog::Level>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_BCLog::Level>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->m_category_log_levels,&LStack_28);
    p_Var4->_M_value =
         oVar3.super__Optional_base<BCLog::Level,_true,_true>._M_payload.
         super__Optional_payload_base<BCLog::Level>._M_payload;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    bVar1 = true;
  }
  else {
LAB_00405a2f:
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
LAB_00405ab0:
  __stack_chk_fail();
}

Assistant:

bool BCLog::Logger::SetCategoryLogLevel(std::string_view category_str, std::string_view level_str)
{
    BCLog::LogFlags flag;
    if (!GetLogCategory(flag, category_str)) return false;

    const auto level = GetLogLevel(level_str);
    if (!level.has_value() || level.value() > MAX_USER_SETABLE_SEVERITY_LEVEL) return false;

    StdLockGuard scoped_lock(m_cs);
    m_category_log_levels[flag] = level.value();
    return true;
}